

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O0

void __thiscall
amrex::InterpBndryData::setBndryValues
          (InterpBndryData *this,BndryRegister *crse,int c_start,MultiFab *fine,int f_start,
          int bnd_start,int num_comp,int ratio,BCRec *bc,int max_order)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int j;
  int i;
  undefined8 in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  int in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined4 in_stack_00000020;
  IntVect *ratio_vect;
  int local_c8;
  int iStack_c4;
  int local_c0;
  int local_bc [2];
  int local_b4;
  int *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined4 local_94;
  undefined8 local_90;
  int local_80 [2];
  int local_78;
  int *local_70;
  IntVect local_64;
  int local_58 [2];
  int local_50;
  IntVect local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  
  local_a8 = in_R9D;
  local_a4 = in_R8D;
  local_a0 = in_RCX;
  local_94 = in_EDX;
  local_90 = in_RSI;
  IntVect::IntVect(&local_48,1);
  local_50 = local_48.vect[2];
  local_58[0] = local_48.vect[0];
  local_58[1] = local_48.vect[1];
  local_c0 = local_48.vect[2];
  local_c8 = local_48.vect[0];
  iStack_c4 = local_48.vect[1];
  uVar1 = _local_c8;
  local_70 = &local_c8;
  local_1c = 0;
  local_c8 = local_48.vect[0];
  i = in_stack_00000010 * local_c8;
  local_2c = 1;
  iStack_c4 = local_48.vect[1];
  j = in_stack_00000010 * iStack_c4;
  local_3c = 2;
  _local_c8 = uVar1;
  local_38 = local_70;
  local_28 = local_70;
  local_18 = local_70;
  IntVect::IntVect(&local_64,i,j,in_stack_00000010 * local_48.vect[2]);
  local_78 = local_64.vect[2];
  local_80[0] = local_64.vect[0];
  local_80[1] = local_64.vect[1];
  local_bc[0] = local_64.vect[0];
  local_bc[1] = local_64.vect[1];
  local_b4 = local_64.vect[2];
  local_b0 = local_bc;
  (**(code **)(*in_RDI + 0x40))
            (in_RDI,local_90,local_94,local_a0,local_a4,local_a8,in_stack_00000008,local_b0,
             in_stack_00000018,in_stack_00000020);
  return;
}

Assistant:

void
InterpBndryData::setBndryValues (BndryRegister&  crse,
                                 int             c_start,
                                 const MultiFab& fine,
                                 int             f_start,
                                 int             bnd_start,
                                 int             num_comp,
                                 int             ratio,
                                 const BCRec&    bc,
                                 int             max_order)
{
    const IntVect& ratio_vect = ratio * IntVect::TheUnitVector();
    setBndryValues(crse,c_start,fine,f_start,bnd_start,num_comp,ratio_vect,bc,max_order);
}